

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<char,fmt::v5::basic_format_specs<char>>::bin_writer<1>>>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *this,
          size_t size,align_spec *spec,
          padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::int_writer<char,_fmt::v5::basic_format_specs<char>_>::bin_writer<1>_>
          f)

{
  byte bVar1;
  size_t __len;
  size_t __n;
  char __tmp;
  size_t __len_1;
  type pcVar2;
  ulong uVar3;
  type local_30;
  
  uVar3 = (ulong)spec->width_;
  __n = uVar3 - size;
  if (uVar3 < size || __n == 0) {
    local_30 = internal::reserve<fmt::v5::internal::basic_buffer<char>>
                         ((back_insert_iterator<fmt::v5::internal::basic_buffer<char>_> *)this,size)
    ;
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<char,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<char,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
                  *)&f,&local_30);
  }
  else {
    local_30 = internal::reserve<fmt::v5::internal::basic_buffer<char>>
                         ((back_insert_iterator<fmt::v5::internal::basic_buffer<char>_> *)this,uVar3
                         );
    bVar1 = (byte)spec->fill_;
    if (spec->align_ == ALIGN_CENTER) {
      uVar3 = __n >> 1;
      pcVar2 = local_30;
      if (1 < __n) {
        pcVar2 = local_30 + uVar3;
        memset(local_30,(uint)bVar1,uVar3);
      }
      local_30 = pcVar2;
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<char,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
      ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<char,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
                    *)&f,&local_30);
      __n = __n - uVar3;
    }
    else {
      if (spec->align_ == ALIGN_RIGHT) {
        pcVar2 = local_30 + __n;
        memset(local_30,(uint)bVar1,__n);
        local_30 = pcVar2;
        padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<char,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
        ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<char,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
                      *)&f,&local_30);
        return;
      }
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<char,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
      ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<char,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
                    *)&f,&local_30);
    }
    memset(local_30,(uint)bVar1,__n);
  }
  return;
}

Assistant:

void basic_writer<Range>::write_padded(
    std::size_t size, const align_spec &spec, F f) {
  unsigned width = spec.width();
  if (width <= size)
    return f(reserve(size));
  auto &&it = reserve(width);
  char_type fill = static_cast<char_type>(spec.fill());
  std::size_t padding = width - size;
  if (spec.align() == ALIGN_RIGHT) {
    it = std::fill_n(it, padding, fill);
    f(it);
  } else if (spec.align() == ALIGN_CENTER) {
    std::size_t left_padding = padding / 2;
    it = std::fill_n(it, left_padding, fill);
    f(it);
    it = std::fill_n(it, padding - left_padding, fill);
  } else {
    f(it);
    it = std::fill_n(it, padding, fill);
  }
}